

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

XercesAttGroupInfo * __thiscall
xercesc_4_0::TraverseSchema::processAttributeGroupRef
          (TraverseSchema *this,DOMElement *elem,XMLCh *refName,ComplexTypeInfo *typeInfo)

{
  SchemaInfo *this_00;
  bool bVar1;
  uint namespaceURI;
  DOMElement *pDVar2;
  DOMElement *local_a0;
  DOMElement *attGroupElem;
  SchemaInfo *impInfo;
  uint local_88;
  uint uriId;
  uint saveScope;
  ListType infoType;
  SchemaInfo *saveInfo;
  XercesAttGroupInfo *attGroupInfo;
  XMLCh *uriStr;
  XMLCh *localPart;
  XMLCh *prefix;
  Janitor<xercesc_4_0::XSAnnotation> janAnnot;
  undefined1 local_40 [8];
  NamespaceScopeManager nsMgr;
  ComplexTypeInfo *typeInfo_local;
  XMLCh *refName_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  nsMgr.fSchemaInfo = (SchemaInfo *)typeInfo;
  NamespaceScopeManager::NamespaceScopeManager
            ((NamespaceScopeManager *)local_40,elem,this->fSchemaInfo,this);
  pDVar2 = XUtil::getFirstChildElement(&elem->super_DOMNode);
  pDVar2 = checkContent(this,elem,pDVar2,true,true);
  if (pDVar2 != (DOMElement *)0x0) {
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgValidityDomain,0x1f,
                      (XMLCh *)SchemaSymbols::fgELT_ATTRIBUTEGROUP,(XMLCh *)0x0,(XMLCh *)0x0,
                      (XMLCh *)0x0);
  }
  Janitor<xercesc_4_0::XSAnnotation>::Janitor
            ((Janitor<xercesc_4_0::XSAnnotation> *)&prefix,this->fAnnotation);
  localPart = getPrefix(this,refName);
  uriStr = getLocalPart(this,refName);
  attGroupInfo = (XercesAttGroupInfo *)resolvePrefixToURI(this,elem,localPart);
  saveInfo = (SchemaInfo *)0x0;
  _saveScope = this->fSchemaInfo;
  uriId = 2;
  local_88 = this->fCurrentScope;
  bVar1 = XMLString::equals((XMLCh *)attGroupInfo,this->fTargetNSURIString);
  if (bVar1) {
    saveInfo = (SchemaInfo *)
               RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::get
                         (this->fAttGroupRegistry,uriStr);
  }
  else {
    impInfo._4_4_ =
         (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                   (this->fURIStringPool,attGroupInfo);
    bVar1 = isImportingNS(this,impInfo._4_4_);
    if (!bVar1) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x8e,(XMLCh *)attGroupInfo,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      this_local = (TraverseSchema *)0x0;
      goto LAB_00434fa4;
    }
    saveInfo = (SchemaInfo *)traverseAttributeGroupDeclNS(this,elem,(XMLCh *)attGroupInfo,uriStr);
    if (saveInfo == (SchemaInfo *)0x0) {
      this_00 = this->fSchemaInfo;
      namespaceURI = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                               (this->fURIStringPool,attGroupInfo);
      attGroupElem = (DOMElement *)SchemaInfo::getImportInfo(this_00,namespaceURI);
      if (((SchemaInfo *)attGroupElem == (SchemaInfo *)0x0) ||
         (bVar1 = SchemaInfo::getProcessed((SchemaInfo *)attGroupElem), bVar1)) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x67,
                          (XMLCh *)SchemaSymbols::fgELT_ATTRIBUTEGROUP,(XMLCh *)attGroupInfo,uriStr,
                          (XMLCh *)0x0);
        this_local = (TraverseSchema *)0x0;
        goto LAB_00434fa4;
      }
      uriId = 1;
      restoreSchemaInfo(this,(SchemaInfo *)attGroupElem,IMPORT,0xfffffffe);
    }
  }
  if (saveInfo == (SchemaInfo *)0x0) {
    local_a0 = SchemaInfo::getTopLevelComponent
                         (this->fSchemaInfo,4,(XMLCh *)SchemaSymbols::fgELT_ATTRIBUTEGROUP,uriStr,
                          &this->fSchemaInfo);
    if (local_a0 != (DOMElement *)0x0) {
      bVar1 = ValueVectorOf<const_xercesc_4_0::DOMElement_*>::containsElement
                        (this->fDeclStack,&local_a0,0);
      if (bVar1) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x56,refName,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
        this_local = (TraverseSchema *)0x0;
      }
      else {
        saveInfo = (SchemaInfo *)
                   traverseAttributeGroupDecl
                             (this,local_a0,(ComplexTypeInfo *)nsMgr.fSchemaInfo,true);
        if ((saveInfo != (SchemaInfo *)0x0) &&
           (this->fCurrentAttGroupInfo != (XercesAttGroupInfo *)0x0)) {
          copyAttGroupAttributes
                    (this,elem,(XercesAttGroupInfo *)saveInfo,this->fCurrentAttGroupInfo,
                     (ComplexTypeInfo *)0x0);
        }
        if (_saveScope != this->fSchemaInfo) {
          restoreSchemaInfo(this,_saveScope,uriId,local_88);
        }
        this_local = (TraverseSchema *)saveInfo;
      }
      goto LAB_00434fa4;
    }
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x67,
                      (XMLCh *)SchemaSymbols::fgELT_ATTRIBUTEGROUP,(XMLCh *)attGroupInfo,uriStr,
                      (XMLCh *)0x0);
  }
  if (saveInfo != (SchemaInfo *)0x0) {
    copyAttGroupAttributes
              (this,elem,(XercesAttGroupInfo *)saveInfo,this->fCurrentAttGroupInfo,
               (ComplexTypeInfo *)nsMgr.fSchemaInfo);
  }
  if (_saveScope != this->fSchemaInfo) {
    restoreSchemaInfo(this,_saveScope,uriId,0xfffffffe);
  }
  this_local = (TraverseSchema *)saveInfo;
LAB_00434fa4:
  impInfo._0_4_ = 1;
  Janitor<xercesc_4_0::XSAnnotation>::~Janitor((Janitor<xercesc_4_0::XSAnnotation> *)&prefix);
  NamespaceScopeManager::~NamespaceScopeManager((NamespaceScopeManager *)local_40);
  return (XercesAttGroupInfo *)this_local;
}

Assistant:

XercesAttGroupInfo*
TraverseSchema::processAttributeGroupRef(const DOMElement* const elem,
                                         const XMLCh* const refName,
                                         ComplexTypeInfo* const typeInfo) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    if (checkContent(elem, XUtil::getFirstChildElement(elem), true) != 0) {
        reportSchemaError(elem ,XMLUni::fgValidityDomain, XMLValid::NoContentForRef, SchemaSymbols::fgELT_ATTRIBUTEGROUP);
    }

    Janitor<XSAnnotation> janAnnot(fAnnotation);
    const                XMLCh* prefix = getPrefix(refName);
    const                XMLCh* localPart = getLocalPart(refName);
    const                XMLCh* uriStr = resolvePrefixToURI(elem, prefix);
    XercesAttGroupInfo*  attGroupInfo = 0;
    SchemaInfo*          saveInfo = fSchemaInfo;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    unsigned int         saveScope = fCurrentScope;

    if (!XMLString::equals(uriStr, fTargetNSURIString)) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(uriStr);

        if (!isImportingNS(uriId)) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uriStr);
            return 0;
        }

        attGroupInfo = traverseAttributeGroupDeclNS(elem, uriStr, localPart);

        if (!attGroupInfo) {
            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(fURIStringPool->addOrFind(uriStr));

            if (!impInfo || impInfo->getProcessed()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DeclarationNotFound,
                                  SchemaSymbols::fgELT_ATTRIBUTEGROUP, uriStr, localPart);
                return 0;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }
    }
    else {

        attGroupInfo = fAttGroupRegistry->get(localPart);
    }

    if (!attGroupInfo) {

        // traverse top level attributeGroup - if found
        DOMElement* attGroupElem = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_AttributeGroup,
            SchemaSymbols::fgELT_ATTRIBUTEGROUP, localPart, &fSchemaInfo);

        if (attGroupElem != 0) {

            // circular attribute check
            if (fDeclStack->containsElement(attGroupElem)) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoCircularDefinition, refName);
                return 0;
            }

            attGroupInfo = traverseAttributeGroupDecl(attGroupElem, typeInfo, true);

            if (attGroupInfo && fCurrentAttGroupInfo) {
                copyAttGroupAttributes(elem, attGroupInfo, fCurrentAttGroupInfo, 0);
            }

            // restore schema information, if necessary
            if (saveInfo != fSchemaInfo) {
                restoreSchemaInfo(saveInfo, infoType, saveScope);
            }

            return attGroupInfo;
        }
        else {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DeclarationNotFound,
                              SchemaSymbols::fgELT_ATTRIBUTEGROUP, uriStr, localPart);
        }
    }

    if (attGroupInfo) {
        copyAttGroupAttributes(elem, attGroupInfo, fCurrentAttGroupInfo, typeInfo);
    }

    // restore schema information, if necessary
    if (saveInfo != fSchemaInfo) {
        restoreSchemaInfo(saveInfo, infoType);
    }

    return attGroupInfo;
}